

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool updateAndroidFiles(Options *options)

{
  bool bVar1;
  long in_RDI;
  Options *in_stack_000001a0;
  Options *in_stack_000001a8;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    fprintf(_stdout,"Updating Android package files with project settings.\n");
  }
  bVar1 = updateLibsXml(in_stack_000001a8);
  if (bVar1) {
    bVar1 = updateAndroidManifest(in_stack_000001a0);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool updateAndroidFiles(Options &options)
{
    if (options.verbose)
        fprintf(stdout, "Updating Android package files with project settings.\n");

    if (!updateLibsXml(&options))
        return false;

    if (!updateAndroidManifest(options))
        return false;

    return true;
}